

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetFilesystemArtifactResultCreator<ArtifactBundleContentDirTag>::Create_abi_cxx11_
          (string *__return_storage_ptr__,
          TargetFilesystemArtifactResultCreator<ArtifactBundleContentDirTag> *this,
          cmGeneratorTarget *target,cmGeneratorExpressionContext *context,
          GeneratorExpressionContent *content)

{
  bool bVar1;
  _Base_ptr *config;
  allocator<char> local_61;
  string outpath;
  string local_40;
  
  bVar1 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)this);
  if (bVar1) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&outpath,(GeneratorExpressionContent *)context);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"TARGET_BUNDLE_CONTENT_DIR not allowed for IMPORTED targets.",
               &local_61);
    reportError((cmGeneratorExpressionContext *)target,&outpath,&local_40);
  }
  else {
    bVar1 = cmGeneratorTarget::IsBundleOnApple((cmGeneratorTarget *)this);
    if (bVar1) {
      config = &(target->Objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      cmGeneratorTarget::GetDirectory
                (&local_40,(cmGeneratorTarget *)this,(string *)config,RuntimeBinaryArtifact);
      std::operator+(&outpath,&local_40,'/');
      std::__cxx11::string::~string((string *)&local_40);
      cmGeneratorTarget::BuildBundleDirectory
                (__return_storage_ptr__,(cmGeneratorTarget *)this,&outpath,(string *)config,
                 ContentLevel);
      std::__cxx11::string::~string((string *)&outpath);
      return __return_storage_ptr__;
    }
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&outpath,(GeneratorExpressionContent *)context);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"TARGET_BUNDLE_CONTENT_DIR is allowed only for Bundle targets.",
               &local_61);
    reportError((cmGeneratorExpressionContext *)target,&outpath,&local_40);
  }
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&outpath);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

static std::string Create(cmGeneratorTarget* target,
                            cmGeneratorExpressionContext* context,
                            const GeneratorExpressionContent* content)
  {
    if (target->IsImported()) {
      ::reportError(
        context, content->GetOriginalExpression(),
        "TARGET_BUNDLE_CONTENT_DIR not allowed for IMPORTED targets.");
      return std::string();
    }
    if (!target->IsBundleOnApple()) {
      ::reportError(
        context, content->GetOriginalExpression(),
        "TARGET_BUNDLE_CONTENT_DIR is allowed only for Bundle targets.");
      return std::string();
    }

    std::string outpath = target->GetDirectory(context->Config) + '/';
    return target->BuildBundleDirectory(outpath, context->Config,
                                        cmGeneratorTarget::ContentLevel);
  }